

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ForkBranchBase::ForkBranchBase(ForkBranchBase *this,OwnForkHubBase *hubParam)

{
  ForkBranchBase **ppFVar1;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00596de8;
  (this->hub).ptr = hubParam->ptr;
  hubParam->ptr = (ForkHubBase *)0x0;
  this->next = (ForkBranchBase *)0x0;
  this->prevPtr = (ForkBranchBase **)0x0;
  ppFVar1 = ((this->hub).ptr)->tailBranch;
  if (ppFVar1 == (ForkBranchBase **)0x0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  else {
    this->prevPtr = ppFVar1;
    *ppFVar1 = this;
    this->next = (ForkBranchBase *)0x0;
    ((this->hub).ptr)->tailBranch = &this->next;
  }
  return;
}

Assistant:

ForkBranchBase::ForkBranchBase(OwnForkHubBase&& hubParam): hub(kj::mv(hubParam)) {
  if (hub->tailBranch == nullptr) {
    onReadyEvent.arm();
  } else {
    // Insert into hub's linked list of branches.
    prevPtr = hub->tailBranch;
    *prevPtr = this;
    next = nullptr;
    hub->tailBranch = &next;
  }
}